

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportconsole.cpp
# Opt level: O0

void __thiscall
trun::ResultsReportConsole::PrintPasses
          (ResultsReportConsole *this,
          vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
          *results)

{
  FILE *__stream;
  bool bVar1;
  bool bVar2;
  kTestResult kVar3;
  reference psVar4;
  element_type *peVar5;
  string *this_00;
  char *pcVar6;
  undefined1 local_48 [8];
  shared_ptr<trun::TestResult> r;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
  *__range1;
  bool haveHeader;
  vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
  *results_local;
  ResultsReportConsole *this_local;
  
  bVar1 = false;
  __end1 = std::
           vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
           ::begin(results);
  r.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
       ::end(results);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_std::shared_ptr<trun::TestResult>_*,_std::vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>_>
                      (&__end1,(__normal_iterator<const_std::shared_ptr<trun::TestResult>_*,_std::vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>_>
                                *)&r.
                                   super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    psVar4 = __gnu_cxx::
             __normal_iterator<const_std::shared_ptr<trun::TestResult>_*,_std::vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>_>
             ::operator*(&__end1);
    std::shared_ptr<trun::TestResult>::shared_ptr((shared_ptr<trun::TestResult> *)local_48,psVar4);
    peVar5 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_48);
    kVar3 = TestResult::Result(peVar5);
    if (kVar3 == kTestResult_Pass) {
      if (!bVar1) {
        fprintf((FILE *)(this->super_ResultsReportPinterBase).fout,"Success:\n");
        bVar1 = true;
      }
      __stream = (FILE *)(this->super_ResultsReportPinterBase).fout;
      peVar5 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_48);
      this_00 = TestResult::SymbolName_abi_cxx11_(peVar5);
      pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(this_00);
      fprintf(__stream,"  [P--]: %s\n",pcVar6);
    }
    std::shared_ptr<trun::TestResult>::~shared_ptr((shared_ptr<trun::TestResult> *)local_48);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<trun::TestResult>_*,_std::vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void ResultsReportConsole::PrintPasses(const std::vector<TestResult::Ref> &results) {
    bool haveHeader = false;
    for(auto r : results) {
        if (r->Result() == kTestResult_Pass) {
            // Only print this the first time - if we have any...
            if (!haveHeader) {
                fprintf(fout, "Success:\n");
                haveHeader = true;
            }
            fprintf(fout, "  [P--]: %s\n",r->SymbolName().c_str());
        }
    }
}